

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_renderbuffers.cpp
# Opt level: O0

void __thiscall FGLRenderBuffers::CreateBloom(FGLRenderBuffers *this,int width,int height)

{
  GLuint GVar1;
  FString local_60;
  FString local_58;
  FString local_50 [3];
  FString local_38;
  FGLBloomTextureLevel *local_30;
  FGLBloomTextureLevel *level;
  GLuint local_20;
  int i;
  int bloomHeight;
  int bloomWidth;
  int height_local;
  int width_local;
  FGLRenderBuffers *this_local;
  
  bloomHeight = height;
  bloomWidth = width;
  _height_local = this;
  ClearBloom(this);
  if ((0 < bloomWidth) && (0 < bloomHeight)) {
    i = MAX<int>(bloomWidth / 2,1);
    local_20 = MAX<int>(bloomHeight / 2,1);
    for (level._4_4_ = 0; level._4_4_ < 4; level._4_4_ = level._4_4_ + 1) {
      local_30 = this->BloomLevels + level._4_4_;
      GVar1 = MAX<int>(i / 2,1);
      local_30->Width = GVar1;
      GVar1 = MAX<int>((int)local_20 / 2,1);
      local_30->Height = GVar1;
      FString::FString(&local_38,"Bloom.VTexture");
      GVar1 = Create2DTexture(this,&local_38,0x881a,local_30->Width,local_30->Height);
      local_30->VTexture = GVar1;
      FString::~FString(&local_38);
      FString::FString(local_50,"Bloom.HTexture");
      GVar1 = Create2DTexture(this,local_50,0x881a,local_30->Width,local_30->Height);
      local_30->HTexture = GVar1;
      FString::~FString(local_50);
      FString::FString(&local_58,"Bloom.VFramebuffer");
      GVar1 = CreateFrameBuffer(this,&local_58,local_30->VTexture);
      local_30->VFramebuffer = GVar1;
      FString::~FString(&local_58);
      FString::FString(&local_60,"Bloom.HFramebuffer");
      GVar1 = CreateFrameBuffer(this,&local_60,local_30->HTexture);
      local_30->HFramebuffer = GVar1;
      FString::~FString(&local_60);
      i = local_30->Width;
      local_20 = local_30->Height;
    }
  }
  return;
}

Assistant:

void FGLRenderBuffers::CreateBloom(int width, int height)
{
	ClearBloom();
	
	// No scene, no bloom!
	if (width <= 0 || height <= 0)
		return;

	int bloomWidth = MAX(width / 2, 1);
	int bloomHeight = MAX(height / 2, 1);
	for (int i = 0; i < NumBloomLevels; i++)
	{
		auto &level = BloomLevels[i];
		level.Width = MAX(bloomWidth / 2, 1);
		level.Height = MAX(bloomHeight / 2, 1);

		level.VTexture = Create2DTexture("Bloom.VTexture", GL_RGBA16F, level.Width, level.Height);
		level.HTexture = Create2DTexture("Bloom.HTexture", GL_RGBA16F, level.Width, level.Height);
		level.VFramebuffer = CreateFrameBuffer("Bloom.VFramebuffer", level.VTexture);
		level.HFramebuffer = CreateFrameBuffer("Bloom.HFramebuffer", level.HTexture);

		bloomWidth = level.Width;
		bloomHeight = level.Height;
	}
}